

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O3

bool __thiscall ftxui::SliderBase<long>::OnEvent(SliderBase<long> *this,Event *event)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  long lVar7;
  _Alloc_hider _Var8;
  Event EStack_e8;
  undefined1 local_a8 [24];
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  ScreenInteractive *local_70;
  undefined1 local_68 [24];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  ScreenInteractive *local_30;
  
  if (event->type_ == Mouse) {
    local_68._16_8_ = *(undefined8 *)((long)&event->field_1 + 0xc);
    local_68._0_4_ = event->type_;
    local_68._4_4_ = (event->field_1).mouse_.button;
    local_68._8_4_ = (event->field_1).mouse_.motion;
    local_68._12_4_ = *(undefined4 *)((long)&event->field_1 + 8);
    pcVar2 = (event->input_)._M_dataplus._M_p;
    local_50._M_p = (pointer)&local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + (event->input_)._M_string_length);
    local_30 = event->screen_;
    bVar4 = OnMouseEvent(this,(Event *)local_68);
    local_80._M_allocated_capacity = local_40._M_allocated_capacity;
    _Var8._M_p = local_50._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p == &local_40) {
      return bVar4;
    }
LAB_0014af29:
    operator_delete(_Var8._M_p,local_80._M_allocated_capacity + 1);
    return bVar4;
  }
  bVar4 = Event::operator==(event,(Event *)Event::ArrowLeft);
  if (!bVar4) {
    Event::Character(&EStack_e8,'h');
    _Var8._M_p = EStack_e8.input_._M_dataplus._M_p;
    sVar3 = (event->input_)._M_string_length;
    if (sVar3 == EStack_e8.input_._M_string_length) {
      if (sVar3 == 0) {
        bVar4 = true;
      }
      else {
        iVar5 = bcmp((event->input_)._M_dataplus._M_p,EStack_e8.input_._M_dataplus._M_p,sVar3);
        bVar4 = iVar5 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    paVar1 = &EStack_e8.input_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var8._M_p != paVar1) {
      operator_delete(_Var8._M_p,EStack_e8.input_.field_2._M_allocated_capacity + 1);
    }
    if (!bVar4) {
      bVar4 = Event::operator==(event,(Event *)Event::ArrowRight);
      if (!bVar4) {
        Event::Character(&EStack_e8,'l');
        sVar3 = (event->input_)._M_string_length;
        if (sVar3 == EStack_e8.input_._M_string_length) {
          if (sVar3 == 0) {
            bVar4 = true;
          }
          else {
            iVar5 = bcmp((event->input_)._M_dataplus._M_p,EStack_e8.input_._M_dataplus._M_p,sVar3);
            bVar4 = iVar5 == 0;
          }
        }
        else {
          bVar4 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)EStack_e8.input_._M_dataplus._M_p != paVar1) {
          operator_delete(EStack_e8.input_._M_dataplus._M_p,
                          EStack_e8.input_.field_2._M_allocated_capacity + 1);
        }
        if (!bVar4) {
          local_a8._16_8_ = *(undefined8 *)((long)&event->field_1 + 0xc);
          local_a8._0_4_ = event->type_;
          local_a8._4_4_ = (event->field_1).mouse_.button;
          local_a8._8_4_ = (event->field_1).mouse_.motion;
          local_a8._12_4_ = *(undefined4 *)((long)&event->field_1 + 8);
          pcVar2 = (event->input_)._M_dataplus._M_p;
          local_90._M_p = (pointer)&local_80;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,pcVar2,pcVar2 + (event->input_)._M_string_length);
          local_70 = event->screen_;
          bVar4 = ComponentBase::OnEvent(&this->super_ComponentBase,(Event *)local_a8);
          _Var8._M_p = local_90._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_p == &local_80) {
            return bVar4;
          }
          goto LAB_0014af29;
        }
      }
      plVar6 = this->value_;
      lVar7 = *plVar6 + this->increment_;
      *plVar6 = lVar7;
      if (this->max_ < lVar7) {
        lVar7 = this->max_;
      }
      goto LAB_0014afc5;
    }
  }
  plVar6 = this->value_;
  lVar7 = *plVar6 - this->increment_;
  *plVar6 = lVar7;
  if (lVar7 <= this->min_) {
    lVar7 = this->min_;
  }
LAB_0014afc5:
  *plVar6 = lVar7;
  return true;
}

Assistant:

bool OnEvent(Event event) final {
    if (event.is_mouse())
      return OnMouseEvent(event);

    if (event == Event::ArrowLeft || event == Event::Character('h')) {
      *value_ -= increment_;
      *value_ = std::max(*value_, min_);
      return true;
    }

    if (event == Event::ArrowRight || event == Event::Character('l')) {
      *value_ += increment_;
      *value_ = std::min(*value_, max_);
      return true;
    }

    return ComponentBase::OnEvent(event);
  }